

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddBtree(WhereLoopBuilder *pBuilder,Bitmask mPrereq)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  WhereLoop *pTemplate;
  SrcList *pSVar4;
  Index *pIVar5;
  WhereTerm *pWVar6;
  ExprList *pEVar7;
  WhereTerm *pTerm;
  bool bVar8;
  u8 uVar9;
  u8 uVar10;
  LogEst LVar11;
  short sVar12;
  ushort uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  u32 uVar17;
  int iVar18;
  undefined6 extraout_var;
  ulong uVar19;
  short sVar20;
  ExprList_item *pEVar21;
  Expr *pA;
  ulong uVar22;
  WhereTerm *pWVar23;
  long lVar24;
  Index *pIdx;
  Bitmask BVar25;
  long lVar26;
  bool bVar27;
  i16 aiColumnPk;
  LogEst aiRowEstPk [2];
  Index sPk;
  i16 local_ea;
  Table *local_e8;
  ulong local_e0;
  WhereInfo *local_d8;
  Bitmask local_d0;
  WhereClause *local_c8;
  ExprList *local_c0;
  ExprList_item *local_b8;
  LogEst local_ac [2];
  Index local_a8;
  
  local_ea = -1;
  pTemplate = pBuilder->pNew;
  local_d8 = pBuilder->pWInfo;
  pSVar4 = local_d8->pTabList;
  bVar2 = pTemplate->iTab;
  local_e8 = pSVar4->a[bVar2].pTab;
  pIVar5 = pSVar4->a[bVar2].pIBIndex;
  pIdx = pIVar5;
  if (pIVar5 == (Index *)0x0) {
    if ((local_e8->tabFlags & 0x20) == 0) {
      pIdx = &local_a8;
      local_a8.aColExpr = (ExprList *)0x0;
      local_a8.colNotIdxed = 0;
      local_a8.zName = (char *)0x0;
      local_a8.azColl = (char **)0x0;
      local_a8.pPartIdxWhere = (Expr *)0x0;
      local_a8.pSchema = (Schema *)0x0;
      local_a8.aSortOrder = (u8 *)0x0;
      local_a8.zColAff = (char *)0x0;
      local_a8.pNext = (Index *)0x0;
      local_a8.aiColumn = &local_ea;
      local_a8.aiRowLogEst = local_ac;
      local_a8.nColumn = 1;
      local_a8.onError = '\x05';
      local_a8._99_5_ = 0;
      local_a8.pTable = local_e8;
      local_a8._88_6_ = (uint6)(ushort)local_e8->szTabRow << 0x20;
      local_a8.nKeyCol = 1;
      local_ac[0] = local_e8->nRowLogEst;
      local_ac[1] = 0;
      if ((pSVar4->a[bVar2].fg.field_0x1 & 1) == 0) {
        local_a8.pNext = local_e8->pIndex;
      }
    }
    else {
      pIdx = local_e8->pIndex;
    }
  }
  local_c8 = pBuilder->pWC;
  sVar20 = local_e8->nRowLogEst;
  iVar18 = 0;
  iVar14 = 0;
  local_d0 = mPrereq;
  if (10 < (long)sVar20) {
    LVar11 = sqlite3LogEst((long)sVar20);
    iVar14 = (int)CONCAT62(extraout_var,LVar11) + -0x21;
  }
  iVar16 = 0;
  if ((((pBuilder->pOrSet == (WhereOrSet *)0x0) &&
       (iVar16 = iVar18, (local_d8->wctrlFlags & 0x20) == 0)) &&
      ((local_d8->pParse->db->flags & 0x8000) != 0)) &&
     (((pIVar5 == (Index *)0x0 && (bVar3 = pSVar4->a[bVar2].fg.field_0x1, (bVar3 & 1) == 0)) &&
      (((bVar3 & 0x28) == 0 &&
       (((local_e8->tabFlags & 0x20) == 0 && (iVar18 = local_c8->nTerm, 0 < (long)iVar18)))))))) {
    pWVar6 = local_c8->a;
    local_e0 = CONCAT44(local_e0._4_4_,iVar14 + sVar20 + 0x1c);
    pTerm = pWVar6;
    do {
      pWVar23 = pTerm + 1;
      iVar16 = 0;
      if ((pTerm->prereqRight & pTemplate->maskSelf) == 0) {
        iVar16 = 0;
        iVar15 = termCanDriveIndex(pTerm,pSVar4->a + bVar2,0);
        if (iVar15 != 0) {
          (pTemplate->u).btree.nEq = 1;
          (pTemplate->u).btree.pIndex = (Index *)0x0;
          pTemplate->nLTerm = 1;
          pTemplate->nSkip = 0;
          *pTemplate->aLTerm = pTerm;
          if ((local_e8->pSelect != (Select *)0x0) ||
             (sVar12 = (short)local_e0, (local_e8->tabFlags & 2) != 0)) {
            sVar12 = (short)iVar14 + sVar20 + -10;
          }
          LVar11 = 0;
          if (0 < sVar12) {
            LVar11 = sVar12;
          }
          pTemplate->rSetup = LVar11;
          pTemplate->nOut = 0x2b;
          LVar11 = sqlite3LogEstAdd((short)iVar14,0x2b);
          pTemplate->rRun = LVar11;
          pTemplate->wsFlags = 0x4000;
          pTemplate->prereq = pTerm->prereqRight | local_d0;
          iVar16 = whereLoopInsert(pBuilder,pTemplate);
        }
      }
    } while ((iVar16 == 0) && (pTerm = pWVar23, pWVar23 < pWVar6 + iVar18));
  }
  if ((iVar16 != 0) || (pIdx == (Index *)0x0)) {
    return iVar16;
  }
  uVar9 = '\x01';
  BVar25 = local_d0;
  do {
    if (((pIdx->pPartIdxWhere == (Expr *)0x0) ||
        (iVar14 = whereUsablePartialIndex(pSVar4->a[bVar2].iCursor,local_c8,pIdx->pPartIdxWhere),
        iVar14 != 0)) && ((pIdx->field_0x64 & 1) == 0)) {
      uVar13 = *pIdx->aiRowLogEst;
      (pTemplate->u).vtab.idxNum = 0;
      (pTemplate->u).btree.nTop = 0;
      pTemplate->nLTerm = 0;
      pTemplate->nSkip = 0;
      pTemplate->iSortIdx = '\0';
      pTemplate->rSetup = 0;
      pTemplate->prereq = BVar25;
      pTemplate->nOut = uVar13;
      (pTemplate->u).btree.pIndex = pIdx;
      bVar8 = true;
      if ((((pIdx->field_0x63 & 4) == 0) &&
          (pEVar7 = pBuilder->pWInfo->pOrderBy, pEVar7 != (ExprList *)0x0)) &&
         (iVar14 = pEVar7->nExpr, 0 < iVar14)) {
        local_e0 = CONCAT44(local_e0._4_4_,pSVar4->a[bVar2].iCursor);
        local_b8 = pEVar7->a;
        lVar24 = 0;
        local_c0 = pEVar7;
        do {
          pA = local_b8[lVar24].pExpr;
          while (pA != (Expr *)0x0) {
            if ((pA->flags >> 0xc & 1) == 0) goto LAB_0017febb;
            if ((pA->flags >> 0x12 & 1) == 0) {
              pEVar21 = (ExprList_item *)&pA->pLeft;
            }
            else {
              pEVar21 = ((pA->x).pList)->a;
            }
            pA = pEVar21->pExpr;
          }
          pA = (Expr *)0x0;
LAB_0017febb:
          if ((pA->op == 0x9e) && (pA->iTable == (int)local_e0)) {
            if (pA->iColumn < 0) {
              bVar8 = false;
              goto LAB_0017ffad;
            }
            if ((ulong)pIdx->nKeyCol != 0) {
              uVar22 = 0;
              do {
                if (pA->iColumn == pIdx->aiColumn[uVar22]) {
                  bVar8 = false;
                  goto LAB_0017ffad;
                }
                uVar22 = uVar22 + 1;
              } while (pIdx->nKeyCol != uVar22);
            }
          }
          else if ((pIdx->aColExpr != (ExprList *)0x0) &&
                  (uVar22 = (ulong)pIdx->nKeyCol, pIdx->nKeyCol != 0)) {
            pEVar21 = pIdx->aColExpr->a;
            uVar19 = 0;
            do {
              if (pIdx->aiColumn[uVar19] == -2) {
                iVar14 = sqlite3ExprCompareSkip(pA,pEVar21->pExpr,(int)local_e0);
                if (iVar14 == 0) {
                  bVar8 = false;
                  BVar25 = local_d0;
                  goto LAB_0017ffad;
                }
                uVar22 = (ulong)pIdx->nKeyCol;
              }
              uVar19 = uVar19 + 1;
              pEVar21 = pEVar21 + 1;
            } while (uVar19 < uVar22);
            iVar14 = local_c0->nExpr;
            BVar25 = local_d0;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 < iVar14);
        bVar8 = true;
      }
LAB_0017ffad:
      if (pIdx->tnum < 1) {
        uVar10 = uVar9;
        if (bVar8) {
          uVar10 = '\0';
        }
        pTemplate->wsFlags = 0x100;
        pTemplate->iSortIdx = uVar10;
        pTemplate->rRun = uVar13 + 0x10;
LAB_00180111:
        whereLoopOutputAdjust(local_c8,pTemplate,uVar13);
        iVar14 = whereLoopInsert(pBuilder,pTemplate);
        pTemplate->nOut = uVar13;
        if (iVar14 != 0) {
          return iVar14;
        }
      }
      else {
        if ((pIdx->field_0x63 & 0x20) == 0) {
          bVar27 = (pSVar4->a[bVar2].colUsed & pIdx->colNotIdxed) == 0;
          uVar17 = (bVar27 | 8) << 6;
        }
        else {
          bVar27 = true;
          uVar17 = 0x240;
        }
        pTemplate->wsFlags = uVar17;
        uVar10 = uVar9;
        if (!bVar8) {
LAB_0018002a:
          pTemplate->iSortIdx = uVar10;
          LVar11 = uVar13 + (short)((pIdx->szIdxRow * 0xf) / (int)local_e8->szTabRow) + 1;
          pTemplate->rRun = LVar11;
          if (!bVar27) {
            sVar20 = uVar13 + 0x10;
            uVar22 = (ulong)uVar13;
            if (0 < (local_d8->sWC).nTerm) {
              iVar14 = pSVar4->a[bVar2].iCursor;
              lVar24 = 0x14;
              lVar26 = 0;
              local_e0 = (ulong)uVar13;
              do {
                pWVar6 = (local_d8->sWC).a;
                iVar18 = sqlite3ExprCoveredByIndex
                                   (*(Expr **)((long)pWVar6 + lVar24 + -0x14),iVar14,pIdx);
                if (iVar18 == 0) break;
                uVar13 = *(ushort *)((long)pWVar6 + lVar24 + -4);
                if (0 < (short)uVar13) {
                  uVar13 = -(ushort)((*(byte *)((long)&pWVar6->pExpr + lVar24) & 0x82) == 0) |
                           0xffec;
                }
                sVar20 = uVar13 + sVar20;
                lVar26 = lVar26 + 1;
                lVar24 = lVar24 + 0x40;
              } while (lVar26 < (local_d8->sWC).nTerm);
              LVar11 = pTemplate->rRun;
              uVar22 = local_e0;
              BVar25 = local_d0;
            }
            uVar13 = (ushort)uVar22;
            LVar11 = sqlite3LogEstAdd(LVar11,sVar20);
            pTemplate->rRun = LVar11;
          }
          goto LAB_00180111;
        }
        uVar10 = '\0';
        if ((((local_e8->tabFlags & 0x20) != 0) || (pIdx->pPartIdxWhere != (Expr *)0x0)) ||
           ((bVar27 &&
            (((((pIdx->field_0x63 & 4) == 0 && (pIdx->szIdxRow < local_e8->szTabRow)) &&
              ((local_d8->wctrlFlags & 4) == 0)) &&
             ((sqlite3Config.bUseCis != 0 &&
              (uVar10 = '\0', (local_d8->pParse->db->dbOptFlags & 0x20) == 0))))))))
        goto LAB_0018002a;
      }
      pBuilder->bldFlags = 0;
      iVar14 = whereLoopAddBtreeIndex(pBuilder,pSVar4->a + bVar2,pIdx,0);
      if (pBuilder->bldFlags == 1) {
        pbVar1 = (byte *)((long)&local_e8->tabFlags + 1);
        *pbVar1 = *pbVar1 | 1;
      }
    }
    else {
      iVar14 = 0;
    }
    if (pSVar4->a[bVar2].pIBIndex != (Index *)0x0) {
      return iVar14;
    }
    if (iVar14 != 0) {
      return iVar14;
    }
    pIdx = pIdx->pNext;
    uVar9 = uVar9 + '\x01';
    if (pIdx == (Index *)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int whereLoopAddBtree(
  WhereLoopBuilder *pBuilder, /* WHERE clause information */
  Bitmask mPrereq             /* Extra prerequesites for using this table */
){
  WhereInfo *pWInfo;          /* WHERE analysis context */
  Index *pProbe;              /* An index we are evaluating */
  Index sPk;                  /* A fake index object for the primary key */
  LogEst aiRowEstPk[2];       /* The aiRowLogEst[] value for the sPk index */
  i16 aiColumnPk = -1;        /* The aColumn[] value for the sPk index */
  SrcList *pTabList;          /* The FROM clause */
  struct SrcList_item *pSrc;  /* The FROM clause btree term to add */
  WhereLoop *pNew;            /* Template WhereLoop object */
  int rc = SQLITE_OK;         /* Return code */
  int iSortIdx = 1;           /* Index number */
  int b;                      /* A boolean value */
  LogEst rSize;               /* number of rows in the table */
  LogEst rLogSize;            /* Logarithm of the number of rows in the table */
  WhereClause *pWC;           /* The parsed WHERE clause */
  Table *pTab;                /* Table being queried */
  
  pNew = pBuilder->pNew;
  pWInfo = pBuilder->pWInfo;
  pTabList = pWInfo->pTabList;
  pSrc = pTabList->a + pNew->iTab;
  pTab = pSrc->pTab;
  pWC = pBuilder->pWC;
  assert( !IsVirtual(pSrc->pTab) );

  if( pSrc->pIBIndex ){
    /* An INDEXED BY clause specifies a particular index to use */
    pProbe = pSrc->pIBIndex;
  }else if( !HasRowid(pTab) ){
    pProbe = pTab->pIndex;
  }else{
    /* There is no INDEXED BY clause.  Create a fake Index object in local
    ** variable sPk to represent the rowid primary key index.  Make this
    ** fake index the first in a chain of Index objects with all of the real
    ** indices to follow */
    Index *pFirst;                  /* First of real indices on the table */
    memset(&sPk, 0, sizeof(Index));
    sPk.nKeyCol = 1;
    sPk.nColumn = 1;
    sPk.aiColumn = &aiColumnPk;
    sPk.aiRowLogEst = aiRowEstPk;
    sPk.onError = OE_Replace;
    sPk.pTable = pTab;
    sPk.szIdxRow = pTab->szTabRow;
    aiRowEstPk[0] = pTab->nRowLogEst;
    aiRowEstPk[1] = 0;
    pFirst = pSrc->pTab->pIndex;
    if( pSrc->fg.notIndexed==0 ){
      /* The real indices of the table are only considered if the
      ** NOT INDEXED qualifier is omitted from the FROM clause */
      sPk.pNext = pFirst;
    }
    pProbe = &sPk;
  }
  rSize = pTab->nRowLogEst;
  rLogSize = estLog(rSize);

#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
  /* Automatic indexes */
  if( !pBuilder->pOrSet      /* Not part of an OR optimization */
   && (pWInfo->wctrlFlags & WHERE_OR_SUBCLAUSE)==0
   && (pWInfo->pParse->db->flags & SQLITE_AutoIndex)!=0
   && pSrc->pIBIndex==0      /* Has no INDEXED BY clause */
   && !pSrc->fg.notIndexed   /* Has no NOT INDEXED clause */
   && HasRowid(pTab)         /* Not WITHOUT ROWID table. (FIXME: Why not?) */
   && !pSrc->fg.isCorrelated /* Not a correlated subquery */
   && !pSrc->fg.isRecursive  /* Not a recursive common table expression. */
  ){
    /* Generate auto-index WhereLoops */
    WhereTerm *pTerm;
    WhereTerm *pWCEnd = pWC->a + pWC->nTerm;
    for(pTerm=pWC->a; rc==SQLITE_OK && pTerm<pWCEnd; pTerm++){
      if( pTerm->prereqRight & pNew->maskSelf ) continue;
      if( termCanDriveIndex(pTerm, pSrc, 0) ){
        pNew->u.btree.nEq = 1;
        pNew->nSkip = 0;
        pNew->u.btree.pIndex = 0;
        pNew->nLTerm = 1;
        pNew->aLTerm[0] = pTerm;
        /* TUNING: One-time cost for computing the automatic index is
        ** estimated to be X*N*log2(N) where N is the number of rows in
        ** the table being indexed and where X is 7 (LogEst=28) for normal
        ** tables or 0.5 (LogEst=-10) for views and subqueries.  The value
        ** of X is smaller for views and subqueries so that the query planner
        ** will be more aggressive about generating automatic indexes for
        ** those objects, since there is no opportunity to add schema
        ** indexes on subqueries and views. */
        pNew->rSetup = rLogSize + rSize;
        if( pTab->pSelect==0 && (pTab->tabFlags & TF_Ephemeral)==0 ){
          pNew->rSetup += 28;
        }else{
          pNew->rSetup -= 10;
        }
        ApplyCostMultiplier(pNew->rSetup, pTab->costMult);
        if( pNew->rSetup<0 ) pNew->rSetup = 0;
        /* TUNING: Each index lookup yields 20 rows in the table.  This
        ** is more than the usual guess of 10 rows, since we have no way
        ** of knowing how selective the index will ultimately be.  It would
        ** not be unreasonable to make this value much larger. */
        pNew->nOut = 43;  assert( 43==sqlite3LogEst(20) );
        pNew->rRun = sqlite3LogEstAdd(rLogSize,pNew->nOut);
        pNew->wsFlags = WHERE_AUTO_INDEX;
        pNew->prereq = mPrereq | pTerm->prereqRight;
        rc = whereLoopInsert(pBuilder, pNew);
      }
    }
  }
#endif /* SQLITE_OMIT_AUTOMATIC_INDEX */

  /* Loop over all indices. If there was an INDEXED BY clause, then only 
  ** consider index pProbe.  */
  for(; rc==SQLITE_OK && pProbe; 
      pProbe=(pSrc->pIBIndex ? 0 : pProbe->pNext), iSortIdx++
  ){
    if( pProbe->pPartIdxWhere!=0
     && !whereUsablePartialIndex(pSrc->iCursor, pWC, pProbe->pPartIdxWhere) ){
      testcase( pNew->iTab!=pSrc->iCursor );  /* See ticket [98d973b8f5] */
      continue;  /* Partial index inappropriate for this query */
    }
    if( pProbe->bNoQuery ) continue;
    rSize = pProbe->aiRowLogEst[0];
    pNew->u.btree.nEq = 0;
    pNew->u.btree.nBtm = 0;
    pNew->u.btree.nTop = 0;
    pNew->nSkip = 0;
    pNew->nLTerm = 0;
    pNew->iSortIdx = 0;
    pNew->rSetup = 0;
    pNew->prereq = mPrereq;
    pNew->nOut = rSize;
    pNew->u.btree.pIndex = pProbe;
    b = indexMightHelpWithOrderBy(pBuilder, pProbe, pSrc->iCursor);
    /* The ONEPASS_DESIRED flags never occurs together with ORDER BY */
    assert( (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || b==0 );
    if( pProbe->tnum<=0 ){
      /* Integer primary key index */
      pNew->wsFlags = WHERE_IPK;

      /* Full table scan */
      pNew->iSortIdx = b ? iSortIdx : 0;
      /* TUNING: Cost of full table scan is (N*3.0). */
      pNew->rRun = rSize + 16;
      ApplyCostMultiplier(pNew->rRun, pTab->costMult);
      whereLoopOutputAdjust(pWC, pNew, rSize);
      rc = whereLoopInsert(pBuilder, pNew);
      pNew->nOut = rSize;
      if( rc ) break;
    }else{
      Bitmask m;
      if( pProbe->isCovering ){
        pNew->wsFlags = WHERE_IDX_ONLY | WHERE_INDEXED;
        m = 0;
      }else{
        m = pSrc->colUsed & pProbe->colNotIdxed;
        pNew->wsFlags = (m==0) ? (WHERE_IDX_ONLY|WHERE_INDEXED) : WHERE_INDEXED;
      }

      /* Full scan via index */
      if( b
       || !HasRowid(pTab)
       || pProbe->pPartIdxWhere!=0
       || ( m==0
         && pProbe->bUnordered==0
         && (pProbe->szIdxRow<pTab->szTabRow)
         && (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0
         && sqlite3GlobalConfig.bUseCis
         && OptimizationEnabled(pWInfo->pParse->db, SQLITE_CoverIdxScan)
          )
      ){
        pNew->iSortIdx = b ? iSortIdx : 0;

        /* The cost of visiting the index rows is N*K, where K is
        ** between 1.1 and 3.0, depending on the relative sizes of the
        ** index and table rows. */
        pNew->rRun = rSize + 1 + (15*pProbe->szIdxRow)/pTab->szTabRow;
        if( m!=0 ){
          /* If this is a non-covering index scan, add in the cost of
          ** doing table lookups.  The cost will be 3x the number of
          ** lookups.  Take into account WHERE clause terms that can be
          ** satisfied using just the index, and that do not require a
          ** table lookup. */
          LogEst nLookup = rSize + 16;  /* Base cost:  N*3 */
          int ii;
          int iCur = pSrc->iCursor;
          WhereClause *pWC2 = &pWInfo->sWC;
          for(ii=0; ii<pWC2->nTerm; ii++){
            WhereTerm *pTerm = &pWC2->a[ii];
            if( !sqlite3ExprCoveredByIndex(pTerm->pExpr, iCur, pProbe) ){
              break;
            }
            /* pTerm can be evaluated using just the index.  So reduce
            ** the expected number of table lookups accordingly */
            if( pTerm->truthProb<=0 ){
              nLookup += pTerm->truthProb;
            }else{
              nLookup--;
              if( pTerm->eOperator & (WO_EQ|WO_IS) ) nLookup -= 19;
            }
          }
          
          pNew->rRun = sqlite3LogEstAdd(pNew->rRun, nLookup);
        }
        ApplyCostMultiplier(pNew->rRun, pTab->costMult);
        whereLoopOutputAdjust(pWC, pNew, rSize);
        rc = whereLoopInsert(pBuilder, pNew);
        pNew->nOut = rSize;
        if( rc ) break;
      }
    }

    pBuilder->bldFlags = 0;
    rc = whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, 0);
    if( pBuilder->bldFlags==SQLITE_BLDF_INDEXED ){
      /* If a non-unique index is used, or if a prefix of the key for
      ** unique index is used (making the index functionally non-unique)
      ** then the sqlite_stat1 data becomes important for scoring the
      ** plan */
      pTab->tabFlags |= TF_StatsUsed;
    }
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    sqlite3Stat4ProbeFree(pBuilder->pRec);
    pBuilder->nRecValid = 0;
    pBuilder->pRec = 0;
#endif
  }
  return rc;
}